

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O2

ChQuaternion<double> *
chrono::QUADRANGLE(ChQuaternion<double> *__return_storage_ptr__,ChQuaternion<double> *q0,
                  ChQuaternion<double> *q1,ChQuaternion<double> *q2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChVector<double> v;
  ChVector<double> cart1;
  ChVector<double> cart0;
  ChQuaternion<double> q_aux;
  ChQuaternion<double> sq0;
  ChQuaternion<double> sq1;
  undefined1 local_118 [16];
  double local_108;
  ChVector<double> local_f8;
  ChVector<double> local_d8;
  ChQuaternion<double> local_b8;
  ChQuaternion<double> local_90;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  local_50.m_data[0] = q1->m_data[0];
  auVar2._0_8_ = -q1->m_data[3];
  auVar2._8_4_ = 0;
  auVar2._12_4_ = 0x80000000;
  local_50.m_data[1]._0_4_ = *(undefined4 *)(q1->m_data + 1);
  local_50.m_data[2]._0_4_ = *(undefined4 *)(q1->m_data + 2);
  local_50.m_data[1]._4_4_ = *(uint *)((long)q1->m_data + 0xc) ^ 0x80000000;
  local_50.m_data[2]._4_4_ = *(uint *)((long)q1->m_data + 0x14) ^ 0x80000000;
  local_50.m_data[3] = (double)vmovlps_avx(auVar2);
  ChQuaternion<double>::operator*(&local_70,&local_50,q2);
  ChQuaternion<double>::Q_to_Rotv(&local_d8,&local_70);
  ChQuaternion<double>::operator*(&local_90,&local_50,q0);
  ChQuaternion<double>::Q_to_Rotv(&local_f8,&local_90);
  auVar3._0_8_ = local_d8.m_data[0] + local_f8.m_data[0];
  auVar3._8_8_ = local_d8.m_data[1] + local_f8.m_data[1];
  auVar1._8_8_ = 0xbfd0000000000000;
  auVar1._0_8_ = 0xbfd0000000000000;
  local_118 = vmulpd_avx512vl(auVar3,auVar1);
  local_108 = (local_d8.m_data[2] + local_f8.m_data[2]) * -0.25;
  local_b8.m_data[0] = 0.0;
  local_b8.m_data[1] = 0.0;
  local_b8.m_data[2] = 0.0;
  local_b8.m_data[3] = 0.0;
  ChQuaternion<double>::Q_from_Rotv(&local_b8,(ChVector<double> *)local_118);
  ChQuaternion<double>::operator*(__return_storage_ptr__,q1,&local_b8);
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<> QUADRANGLE(const ChQuaternion<>& q0, const ChQuaternion<>& q1, const ChQuaternion<>& q2) {
       
	ChQuaternion<> qInv = q1.GetConjugate();

	ChQuaternion<> sq1 = qInv * q2;
        
	ChVector<> cart0 = sq1.Q_to_Rotv(); 
 
	ChQuaternion<> sq0 = qInv * q0;

	ChVector<> cart1 = sq0.Q_to_Rotv();

	ChVector<> cart_aux = (cart0 + cart1) * -0.25;

	ChQuaternion<> q_aux; q_aux.Q_from_Rotv(cart_aux);

	return q1 * q_aux; 
 }